

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.c
# Opt level: O2

void apx_port_create(apx_port_t *self,apx_portType_t port_type,char *name,int32_t line_number)

{
  char *pcVar1;
  
  if (self != (apx_port_t *)0x0) {
    self->port_type = port_type;
    self->port_id = 0xffffffff;
    self->line_number = line_number;
    if (name == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = strdup(name);
    }
    self->name = pcVar1;
    apx_dataSignature_create(&self->data_signature);
    self->attributes = (apx_portAttributes_t *)0x0;
    self->proper_init_value = (dtl_dv_t *)0x0;
  }
  return;
}

Assistant:

void apx_port_create(apx_port_t* self, apx_portType_t port_type, const char* name, int32_t line_number)
{
   if (self != NULL)
   {
      self->port_type = port_type;
      self->port_id = APX_INVALID_PORT_ID;
      self->line_number = line_number;
      self->name = (name != 0) ? STRDUP(name) : 0;
      apx_dataSignature_create(&self->data_signature);
      self->attributes = NULL;
      self->proper_init_value = NULL;
   }
}